

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::RecursiveMessage::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  string *value;
  RecursiveMessage **v1;
  RecursiveMessage **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena_00;
  RecursiveMessage *pRVar4;
  LogMessage local_a8;
  Voidify local_91;
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  RecursiveMessage *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  RecursiveMessage *from;
  RecursiveMessage *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_28;
  string *local_20;
  RecursiveMessage *local_18;
  anon_union_24_1_493b367e_for_RecursiveMessage_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (RecursiveMessage *)to_msg;
  _this = (RecursiveMessage *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_68 = (RecursiveMessage *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::RecursiveMessage_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<proto2_unittest::RecursiveMessage*>
                 (&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::RecursiveMessage_const*,proto2_unittest::RecursiveMessage*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x33ff,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_90 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pRVar4 = from;
  local_90 = *puVar3;
  if ((local_90 & 3) != 0) {
    if ((local_90 & 1) != 0) {
      local_20 = _internal_payload_abi_cxx11_((RecursiveMessage *)arena);
      local_18 = pRVar4;
      local_10 = &pRVar4->field_0;
      puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                         (&(pRVar4->field_0)._impl_._has_bits_,0);
      value = local_20;
      *puVar3 = *puVar3 | 1;
      arena_00 = google::protobuf::MessageLite::GetArena(&pRVar4->super_MessageLite);
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(pRVar4->field_0)._impl_.payload_,value,arena_00);
    }
    if ((local_90 & 2) != 0) {
      if ((arena->impl_).head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                   ,0x3409,"from._impl_.recurse_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if ((from->field_0)._impl_.recurse_ == (RecursiveMessage *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).head_._M_b._M_p;
        local_28 = absl_log_internal_check_op_result;
        pRVar4 = (RecursiveMessage *)
                 google::protobuf::Arena::CopyConstruct<proto2_unittest::RecursiveMessage>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.recurse_ = pRVar4;
      }
      else {
        MergeFrom((from->field_0)._impl_.recurse_,(RecursiveMessage *)(arena->impl_).head_._M_b._M_p
                 );
      }
    }
  }
  uVar1 = local_90;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void RecursiveMessage::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<RecursiveMessage*>(&to_msg);
  auto& from = static_cast<const RecursiveMessage&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.RecursiveMessage)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_payload(from._internal_payload());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.recurse_ != nullptr);
      if (_this->_impl_.recurse_ == nullptr) {
        _this->_impl_.recurse_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.recurse_);
      } else {
        _this->_impl_.recurse_->MergeFrom(*from._impl_.recurse_);
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}